

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O2

void phyr::workerThreadFunc(int tIndex,shared_ptr<phyr::Barrier> *barrier)

{
  _Manager_type p_Var1;
  function<void_(long)> *this;
  int iVar2;
  long lVar3;
  int64_t index;
  _Manager_type __args;
  string *__return_storage_ptr__;
  _Manager_type p_Var4;
  _Manager_type p_Var5;
  long in_FS_OFFSET;
  string local_60;
  unique_lock<std::mutex> lock;
  
  __return_storage_ptr__ = &local_60;
  formatString<char_const*,int,int>
            (__return_storage_ptr__,
             "[%s] \x1b[37;1mINFO(%d):\x1b[0m Started execution in worker thread %d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/concurrency.cpp"
             ,0x4d,tIndex);
  std::operator<<((ostream *)&std::cout,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  *(int *)(in_FS_OFFSET + -0x13a8) = tIndex;
  Barrier::wait((barrier->super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                __return_storage_ptr__);
  std::__shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>::reset
            (&barrier->super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>);
  std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)workListMutex);
  do {
    while( true ) {
      this = workList;
      if (shutdownThreads != '\0') {
        formatString<char_const*,int,int>
                  (&local_60,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Exiting worker thread %d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/concurrency.cpp"
                   ,0x88,tIndex);
        std::operator<<((ostream *)&std::cout,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::unique_lock<std::mutex>::~unique_lock(&lock);
        return;
      }
      if ((_ZN4phyrL17reportWorkerStatsE_0 & 1) == 0) break;
      LOCK();
      reporterCount = reporterCount + -1;
      UNLOCK();
      if (reporterCount == 0) {
        std::condition_variable::notify_one();
      }
LAB_001337c8:
      std::condition_variable::wait((unique_lock *)workListCondition);
    }
    if (workList == (function<void_(long)> *)0x0) goto LAB_001337c8;
    p_Var1 = *(_Manager_type *)&workList[2].super__Function_base._M_functor;
    __args = workList[2].super__Function_base._M_manager;
    p_Var4 = __args + *(int *)((long)&workList[2].super__Function_base._M_functor + 8);
    p_Var5 = p_Var4;
    if ((long)p_Var1 < (long)p_Var4) {
      p_Var5 = p_Var1;
    }
    workList[2].super__Function_base._M_manager = p_Var5;
    if ((long)p_Var1 <= (long)p_Var4) {
      workList = *(function<void_(long)> **)&this[3].super__Function_base._M_functor;
    }
    *(int *)&this[2]._M_invoker = *(int *)&this[2]._M_invoker + 1;
    std::unique_lock<std::mutex>::unlock(&lock);
    for (; (long)__args < (long)p_Var5; __args = __args + 1) {
      if ((this->super__Function_base)._M_manager == (_Manager_type)0x0) {
        lVar3 = (long)*(int *)((long)&this[3].super__Function_base._M_functor + 8);
        std::function<void_(phyr::Point2<int>)>::operator()
                  ((function<void_(phyr::Point2<int>)> *)(this + 1),
                   (Point2<int>)((long)__args % lVar3 & 0xffffffffU | (long)__args / lVar3 << 0x20))
        ;
      }
      else {
        std::function<void_(long)>::operator()(this,(long)__args);
      }
    }
    std::unique_lock<std::mutex>::lock(&lock);
    p_Var1 = this[2].super__Function_base._M_manager;
    lVar3 = *(long *)&this[2].super__Function_base._M_functor;
    iVar2 = *(int *)&this[2]._M_invoker + -1;
    *(int *)&this[2]._M_invoker = iVar2;
    if (iVar2 == 0 && lVar3 <= (long)p_Var1) {
      std::condition_variable::notify_all();
    }
  } while( true );
}

Assistant:

static void workerThreadFunc(int tIndex, std::shared_ptr<Barrier> barrier) {
    LOG_INFO_FMT("Started execution in worker thread %d", tIndex);
    ThreadIndex = tIndex;

    // The main thread sets up a barrier so that it can be sure that all
    // workers have called ProfilerWorkerThreadInit() before it continues
    // (and actually starts the profiling system).
    barrier->wait();

    // Release our reference to the Barrier so that it's freed once all of
    // the threads have cleared it.
    barrier.reset();

    std::unique_lock<std::mutex> lock(workListMutex);
    while (!shutdownThreads) {
        if (reportWorkerStats) {
            if (--reporterCount == 0)
                // Once all worker threads have merged their stats, wake up
                // the main thread.
                reportDoneCondition.notify_one();
            // Now sleep again.
            workListCondition.wait(lock);
        } else if (!workList) {
            // Sleep until there are more tasks to run
            workListCondition.wait(lock);
        } else {
            // Get work from _workList_ and run loop iterations
            ParallelForLoop &loop = *workList;

            // Run a chunk of loop iterations for _loop_

            // Find the set of loop iterations to run next
            int64_t indexStart = loop.nextIndex;
            int64_t indexEnd =
                std::min(indexStart + loop.chunkSize, loop.maxIndex);

            // Update _loop_ to reflect iterations this thread will run
            loop.nextIndex = indexEnd;
            if (loop.nextIndex == loop.maxIndex) workList = loop.next;
            loop.activeWorkers++;

            // Run loop indices in _[indexStart, indexEnd)_
            lock.unlock();
            for (int64_t index = indexStart; index < indexEnd; ++index) {
                if (loop.func1D) {
                    loop.func1D(index);
                }
                // Handle other types of loops
                else {
                    ASSERT(loop.func2D);
                    loop.func2D(Point2i(index % loop.nX, index / loop.nX));
                }
            }
            lock.lock();

            // Update _loop_ to reflect completion of iterations
            loop.activeWorkers--;
            if (loop.finished()) workListCondition.notify_all();
        }
    }
    LOG_INFO_FMT("Exiting worker thread %d", tIndex);
}